

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_and__Test::~correctness_and__Test(correctness_and__Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(correctness, and_) {
    big_integer a = 0x55;
    big_integer b = 0xaa;

    EXPECT_TRUE((a & b) == 0);
    EXPECT_TRUE((a & 0xcc) == 0x44);
    a &= b;
    EXPECT_TRUE(a == 0);
}